

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O1

void __thiscall
POSGDiscrete::CreateNewRewardModel(POSGDiscrete *this,Index agentI,size_t nrS,size_t nrJA)

{
  pointer ppRVar1;
  RewardModelMapping *pRVar2;
  ulong uVar3;
  string local_70;
  string local_50;
  
  uVar3 = (ulong)agentI;
  if (this->_m_initialized == true) {
    ppRVar1 = (this->_m_p_rModel).
              super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_p_rModel).
                      super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
    }
    pRVar2 = ppRVar1[uVar3];
    if (pRVar2 != (RewardModelMapping *)0x0) {
      (**(code **)((long)(pRVar2->super_RewardModel).super_RewardModelDiscreteInterface.
                         super_QTableInterface + 0x18))();
    }
  }
  pRVar2 = (RewardModelMapping *)operator_new(0x80);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
  RewardModelMapping::RewardModelMapping(pRVar2,nrS,nrJA,&local_50,&local_70);
  ppRVar1 = (this->_m_p_rModel).
            super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_m_p_rModel).
                            super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3)) {
    ppRVar1[uVar3] = pRVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
}

Assistant:

void POSGDiscrete::CreateNewRewardModel
    (Index agentI, size_t nrS, size_t nrJA)
{
    if(_m_initialized)
    delete(_m_p_rModel.at(agentI));

    _m_p_rModel.at(agentI) = new RewardModelMapping( nrS, nrJA);
}